

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_special_functions.cc
# Opt level: O0

void check_function<arg_res_tuple<long_double,1ul>,long_double>
               (arg_res_tuple<long_double,_1UL> *x_yref,longdouble y)

{
  StringRef capturedExpression;
  ExprLhs<bool> EVar1;
  __tuple_element_t<0UL,_tuple<long_double,_long_double>_> *p_Var2;
  __tuple_element_t<1UL,_tuple<long_double,_long_double>_> *p_Var3;
  ostream *poVar4;
  basic_ostream<char,_std::char_traits<char>_> *pbVar5;
  ScopedMessage *this;
  MessageBuilder *builder;
  AssertionHandler *this_00;
  MessageBuilder *pMVar6;
  long in_RDI;
  longdouble in_stack_00000008;
  AssertionHandler catchAssertionHandler;
  ScopedMessage scopedMessage0;
  stringstream stream;
  longdouble y_max;
  longdouble y_min;
  tuple<long_double,_long_double> y_min_max;
  longdouble y_ref;
  undefined4 uVar7;
  Flags resultDisposition;
  undefined2 uVar8;
  undefined6 in_stack_fffffffffffffbf2;
  undefined4 in_stack_fffffffffffffbf8;
  OfType in_stack_fffffffffffffbfc;
  undefined6 in_stack_fffffffffffffc00;
  undefined1 in_stack_fffffffffffffc06;
  undefined1 in_stack_fffffffffffffc07;
  undefined1 uVar9;
  StringRef *in_stack_fffffffffffffc08;
  SourceLineInfo *this_01;
  MessageBuilder *in_stack_fffffffffffffc10;
  SourceLineInfo *this_02;
  undefined2 in_stack_fffffffffffffc78;
  undefined6 uStack_386;
  SourceLineInfo local_360;
  StringRef local_350;
  string local_2f8 [32];
  SourceLineInfo local_2d8;
  StringRef local_2c8;
  int local_1f4;
  stringstream local_1f0 [16];
  undefined1 local_1e0 [376];
  longdouble local_68;
  longdouble local_58;
  undefined1 local_48 [32];
  unkbyte10 local_28;
  longdouble local_18;
  
  local_18 = in_stack_00000008;
  local_28 = *(unkbyte10 *)(in_RDI + 0x10);
  bounds<long_double>((longdouble)CONCAT28(in_stack_fffffffffffffc78,local_48));
  p_Var2 = std::get<0ul,long_double,long_double>((tuple<long_double,_long_double> *)0x3e082d);
  local_58 = *(longdouble *)p_Var2;
  p_Var3 = std::get<1ul,long_double,long_double>((tuple<long_double,_long_double> *)0x3e0843);
  local_68 = *(longdouble *)p_Var3;
  std::__cxx11::stringstream::stringstream(local_1f0);
  uVar8 = SUB82(local_1e0,0);
  uStack_386 = (undefined6)((ulong)local_1e0 >> 0x10);
  local_1f4 = (int)Catch::clara::std::setprecision(0x13);
  poVar4 = std::operator<<((ostream *)CONCAT62(uStack_386,uVar8),(_Setprecision)local_1f4);
  std::operator<<(poVar4,"args: ");
  pbVar5 = operator<<((basic_ostream<char,_std::char_traits<char>_> *)in_stack_fffffffffffffc10,
                      (args<long_double,_1UL> *)in_stack_fffffffffffffc08);
  poVar4 = std::operator<<((ostream *)pbVar5,"\n");
  poVar4 = std::operator<<(poVar4,"lower bound: ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_58);
  this = (ScopedMessage *)std::operator<<(poVar4,"\n");
  builder = (MessageBuilder *)std::operator<<((ostream *)this,"upper bound: ");
  poVar4 = (ostream *)std::ostream::operator<<(builder,local_68);
  poVar4 = std::operator<<(poVar4,"\n");
  this_00 = (AssertionHandler *)std::operator<<(poVar4,"actual     : ");
  uVar7 = SUB104(local_18,0);
  resultDisposition = (Flags)((unkuint10)local_18 >> 0x20);
  uVar8 = (undefined2)((unkuint10)local_18 >> 0x40);
  std::ostream::operator<<(this_00,local_18);
  local_2c8 = operator____catch_sr
                        ((char *)CONCAT62(in_stack_fffffffffffffbf2,uVar8),
                         CONCAT44(resultDisposition,uVar7));
  this_02 = &local_2d8;
  Catch::SourceLineInfo::SourceLineInfo
            (this_02,
             "/workspace/llm4binary/github/license_c_cmakelists/rabauke[P]trng4/tests/test_special_functions.cc"
             ,0x79);
  Catch::MessageBuilder::MessageBuilder
            (in_stack_fffffffffffffc10,in_stack_fffffffffffffc08,
             (SourceLineInfo *)
             CONCAT17(in_stack_fffffffffffffc07,
                      CONCAT16(in_stack_fffffffffffffc06,in_stack_fffffffffffffc00)),
             in_stack_fffffffffffffbfc);
  std::__cxx11::stringstream::str();
  pMVar6 = Catch::MessageBuilder::operator<<
                     ((MessageBuilder *)CONCAT62(in_stack_fffffffffffffbf2,uVar8),
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      CONCAT44(resultDisposition,uVar7));
  Catch::ScopedMessage::ScopedMessage(this,builder);
  std::__cxx11::string::~string(local_2f8);
  Catch::MessageBuilder::~MessageBuilder
            ((MessageBuilder *)CONCAT62(in_stack_fffffffffffffbf2,uVar8));
  local_350 = operator____catch_sr
                        ((char *)CONCAT62(in_stack_fffffffffffffbf2,uVar8),
                         CONCAT44(resultDisposition,uVar7));
  this_01 = &local_360;
  Catch::SourceLineInfo::SourceLineInfo
            (this_01,
             "/workspace/llm4binary/github/license_c_cmakelists/rabauke[P]trng4/tests/test_special_functions.cc"
             ,0x7a);
  Catch::StringRef::StringRef
            ((StringRef *)
             CONCAT17(in_stack_fffffffffffffc07,
                      CONCAT16(in_stack_fffffffffffffc06,in_stack_fffffffffffffc00)),
             (char *)CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8));
  capturedExpression.m_size = (size_type)pMVar6;
  capturedExpression.m_start = (char *)this_01;
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)
             CONCAT17(in_stack_fffffffffffffc07,
                      CONCAT16(in_stack_fffffffffffffc06,in_stack_fffffffffffffc00)),
             (StringRef *)CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8),
             (SourceLineInfo *)CONCAT62(in_stack_fffffffffffffbf2,uVar8),capturedExpression,
             resultDisposition);
  uVar9 = local_58 <= local_18 && local_18 <= local_68;
  EVar1 = Catch::Decomposer::operator<=((Decomposer *)CONCAT44(resultDisposition,uVar7),false);
  Catch::AssertionHandler::handleExpr<bool>(this_00,(ExprLhs<bool> *)this_02);
  Catch::AssertionHandler::complete((AssertionHandler *)CONCAT62(in_stack_fffffffffffffbf2,uVar8));
  Catch::AssertionHandler::~AssertionHandler
            ((AssertionHandler *)CONCAT62(in_stack_fffffffffffffbf2,uVar8));
  Catch::ScopedMessage::~ScopedMessage
            ((ScopedMessage *)CONCAT17(uVar9,CONCAT16(EVar1.m_lhs,in_stack_fffffffffffffc00)));
  std::__cxx11::stringstream::~stringstream(local_1f0);
  return;
}

Assistant:

void check_function(const T_ref &x_yref, const T y) {
  const T y_ref{x_yref.y};
  const std::tuple<T, T> y_min_max{bounds(y_ref)};
  const T y_min{std::get<0>(y_min_max)};
  const T y_max{std::get<1>(y_min_max)};
  std::stringstream stream;
  stream << std::setprecision(std::numeric_limits<T>::digits10 + 1)
         << "args: " << x_yref.x << "\n"
         << "lower bound: " << y_min << "\n"
         << "upper bound: " << y_max << "\n"
         << "actual     : " << y;
  INFO(stream.str());
  REQUIRE((y_min <= y and y <= y_max));
}